

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O3

void __thiscall r_comp::Decompiler::write_hlp(Decompiler *this,uint16_t read_index)

{
  byte bVar1;
  ushort uVar2;
  bool after_tail_wildcard;
  bool local_33;
  char local_32;
  char local_31;
  
  this->in_hlp = true;
  if (this->closing_set == true) {
    this->closing_set = false;
    write_indent(this,this->indents);
  }
  OutStream::push<char>(this->out_stream,&local_32,read_index);
  write_expression_head(this,read_index);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this->out_stream->stream," ",1);
  r_code::vector<r_code::Atom>::operator[]
            ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)read_index);
  bVar1 = r_code::Atom::getAtomCount();
  if (bVar1 != 0) {
    uVar2 = 0;
    do {
      if (this->closing_set == true) {
        this->closing_set = false;
        write_indent(this,this->indents);
      }
      if (uVar2 < 2) {
        this->hlp_postfix = true;
      }
      write_any(this,read_index + 1,&local_33,false,0);
      this->hlp_postfix = false;
      if (this->closing_set == false) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this->out_stream->stream,"\n",1);
      }
      read_index = read_index + 1;
      uVar2 = uVar2 + 1;
    } while (bVar1 != uVar2);
  }
  if (this->closing_set != false) {
    this->closing_set = false;
    write_indent(this,this->indents);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this->out_stream->stream,&local_31,1);
  this->in_hlp = false;
  return;
}

Assistant:

void Decompiler::write_hlp(uint16_t read_index)
{
    in_hlp = true;

    if (closing_set) {
        closing_set = false;
        write_indent(indents);
    }

    out_stream->push('(', read_index);
    write_expression_head(read_index);
    *out_stream << " ";
    uint16_t arity = current_object->code[read_index].getAtomCount();
    bool after_tail_wildcard = false;

    for (uint16_t i = 0; i < arity; ++i) {
        if (after_tail_wildcard) {
            write_any(++read_index, after_tail_wildcard, false);
        } else {
            if (closing_set) {
                closing_set = false;
                write_indent(indents);
            }

            if (i == 0 || i == 1) {
                hlp_postfix = true;
            }

            write_any(++read_index, after_tail_wildcard, false);
            hlp_postfix = false;

            if (!closing_set) {
                *out_stream << "\n";
            }
        }
    }

    if (closing_set) {
        closing_set = false;
        write_indent(indents);
    }

    *out_stream << ')';
    in_hlp = false;
}